

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O2

void CreateBackwardReferencesNH42
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  BrotliEncoderDictionary *pBVar7;
  void *pvVar8;
  void *pvVar9;
  HasherCommon *pHVar10;
  uint8_t *puVar11;
  BrotliDictionary *pBVar12;
  undefined8 uVar13;
  int iVar14;
  uint16_t uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  byte bVar19;
  ulong uVar20;
  ulong *puVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ushort uVar25;
  uint32_t uVar26;
  uint uVar27;
  size_t sVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  int last_distance;
  ulong *puVar33;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  int iVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  long lVar47;
  size_t sVar48;
  uint32_t *addr;
  int iVar49;
  ulong uVar50;
  bool bVar51;
  ulong local_170;
  ulong local_168;
  ulong local_140;
  ulong local_138;
  size_t local_128;
  ulong local_110;
  ulong local_100;
  ulong local_e8;
  Command *local_e0;
  int local_d8;
  uint local_d4;
  ulong local_c0;
  ulong local_98;
  uint8_t *s1_orig;
  
  uVar17 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar3 = (position - 3) + num_bytes;
  sVar28 = position;
  if (3 < num_bytes) {
    sVar28 = uVar3;
  }
  sVar5 = params->stream_offset;
  lVar29 = 0x200;
  if (params->quality < 9) {
    lVar29 = 0x40;
  }
  local_128 = *last_insert_len;
  iVar42 = (int)*(undefined8 *)dist_cache;
  iVar49 = (int)((ulong)*(undefined8 *)dist_cache >> 0x20);
  sVar6 = (params->dictionary).compound.total_size;
  dist_cache[4] = iVar42 + -1;
  dist_cache[5] = iVar42 + 1;
  dist_cache[6] = iVar42 + -2;
  dist_cache[7] = iVar42 + 2;
  dist_cache[8] = iVar42 + -3;
  dist_cache[9] = iVar42 + 3;
  dist_cache[10] = iVar49 + -1;
  dist_cache[0xb] = iVar49 + 1;
  dist_cache[0xc] = iVar49 + -2;
  dist_cache[0xd] = iVar49 + 2;
  dist_cache[0xe] = iVar49 + -3;
  dist_cache[0xf] = iVar49 + 3;
  uVar1 = position + num_bytes;
  uVar4 = (position - 4) + num_bytes;
  uVar40 = lVar29 + position;
  lVar18 = sVar6 + 1;
  local_e0 = commands;
LAB_0035131b:
LAB_00351328:
  uVar23 = position;
  if (uVar1 <= uVar23 + 4) {
    *last_insert_len = (local_128 + uVar1) - uVar23;
    *num_commands = *num_commands + ((long)local_e0 - (long)commands >> 4);
    return;
  }
  uVar39 = uVar17;
  if (uVar23 < uVar17) {
    uVar39 = uVar23;
  }
  uVar41 = sVar5 + uVar23;
  if (uVar17 <= sVar5 + uVar23) {
    uVar41 = uVar17;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_d4 = 0;
    local_98 = 0;
    goto LAB_003513c6;
  }
  if (uVar23 == 0) {
    local_98 = 0;
LAB_003513a2:
    uVar46 = 0;
  }
  else {
    local_98 = (ulong)ringbuffer[uVar23 - 1 & ringbuffer_mask];
    if (uVar23 == 1) goto LAB_003513a2;
    uVar46 = (ulong)ringbuffer[uVar23 - 2 & ringbuffer_mask];
  }
  local_d4 = (uint)(params->dictionary).contextual.context_map
                   [literal_context_lut[uVar46 + 0x100] | literal_context_lut[local_98]];
LAB_003513c6:
  local_110 = uVar1 - uVar23;
  pBVar7 = (params->dictionary).contextual.dict[local_d4];
  uVar46 = (params->dist).max_distance;
  pvVar8 = (hasher->privat)._H42.extra[0];
  pvVar9 = (hasher->privat)._H42.extra[1];
  uVar37 = uVar23 & ringbuffer_mask;
  puVar2 = (ulong *)(ringbuffer + uVar37);
  uVar32 = (uint)(*(int *)(ringbuffer + uVar37) * 0x1e35a7bd) >> 0x11;
  uVar34 = 0x7e4;
  uVar50 = 0;
  uVar35 = 0;
  lVar43 = 0;
  local_168 = 0;
  do {
    if (lVar43 == 0x10) {
      uVar24 = (ulong)uVar32;
      uVar36 = uVar32 & 0x1ff;
      sVar48 = (hasher->privat)._H42.max_hops;
      uVar44 = uVar23 - *(uint *)((long)pvVar8 + uVar24 * 4);
      uVar25 = *(ushort *)((long)pvVar8 + uVar24 * 2 + 0x20000);
      uVar16 = uVar36 << 0xb;
      uVar38 = 0;
      uVar20 = uVar44;
      uVar30 = local_168;
      do {
        local_168 = uVar30;
        local_138 = uVar50;
        local_140 = uVar35;
        uVar22 = uVar34;
        do {
          do {
            do {
              do {
                bVar51 = sVar48 == 0;
                sVar48 = sVar48 - 1;
                if ((bVar51) || (uVar38 = uVar38 + uVar20, uVar39 < uVar38)) {
                  uVar25 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar36 * 2);
                  *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar36 * 2) = uVar25 + 1;
                  uVar36 = uVar25 & 0x1ff;
                  *(char *)((long)pvVar8 + (uVar23 & 0xffff) + 0x30000) = (char)uVar32;
                  if (0xfffe < uVar44) {
                    uVar44 = 0xffff;
                  }
                  *(short *)((long)pvVar9 + (ulong)uVar36 * 4 + (ulong)uVar16) = (short)uVar44;
                  *(undefined2 *)((long)pvVar9 + (ulong)uVar36 * 4 + (ulong)uVar16 + 2) =
                       *(undefined2 *)((long)pvVar8 + uVar24 * 2 + 0x20000);
                  *(int *)((long)pvVar8 + uVar24 * 4) = (int)uVar23;
                  *(short *)((long)pvVar8 + uVar24 * 2 + 0x20000) = (short)uVar36;
                  iVar42 = 0;
                  if (uVar22 != 0x7e4) goto LAB_0035195f;
                  pHVar10 = (hasher->privat)._H42.common;
                  uVar39 = pHVar10->dict_num_lookups;
                  local_170 = pHVar10->dict_num_matches;
                  if (local_170 < uVar39 >> 7) goto LAB_0035196e;
                  uVar34 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                  puVar11 = pBVar7->hash_table_lengths;
                  iVar42 = 0;
                  uVar22 = 0x7e4;
                  lVar43 = 0;
                  goto LAB_00351799;
                }
                uVar34 = (ulong)uVar25;
                uVar25 = *(ushort *)((long)pvVar9 + uVar34 * 4 + (ulong)uVar16 + 2);
                uVar20 = (ulong)*(ushort *)((long)pvVar9 + uVar34 * 4 + (ulong)uVar16);
              } while (ringbuffer_mask < uVar37 + local_168);
              uVar35 = uVar23 - uVar38 & ringbuffer_mask;
              uVar34 = uVar35 + local_168;
            } while ((ringbuffer_mask < uVar34) ||
                    (ringbuffer[uVar37 + local_168] != ringbuffer[uVar34]));
            puVar21 = (ulong *)(ringbuffer + uVar35);
            lVar43 = 0;
            puVar33 = puVar2;
            uVar34 = local_110;
LAB_003515ff:
            if (uVar34 < 8) {
              for (uVar35 = 0;
                  (uVar34 != uVar35 &&
                  (*(char *)((long)puVar21 + uVar35) == *(char *)((long)puVar33 + uVar35)));
                  uVar35 = uVar35 + 1) {
              }
            }
            else {
              if (*puVar33 == *puVar21) goto code_r0x00351610;
              uVar35 = *puVar21 ^ *puVar33;
              uVar34 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                }
              }
              uVar35 = uVar34 >> 3 & 0x1fffffff;
            }
            uVar35 = uVar35 - lVar43;
          } while (uVar35 < 4);
          iVar42 = 0x1f;
          if ((uint)uVar38 != 0) {
            for (; (uint)uVar38 >> iVar42 == 0; iVar42 = iVar42 + -1) {
            }
          }
          uVar34 = (ulong)(iVar42 * -0x1e + 0x780) + uVar35 * 0x87;
          uVar50 = uVar38;
          uVar30 = uVar35;
        } while (uVar34 <= uVar22);
      } while( true );
    }
    uVar30 = (ulong)dist_cache[lVar43];
    uVar20 = uVar23 - uVar30;
    if ((((lVar43 == 0) || (*(char *)((long)pvVar8 + (uVar20 & 0xffff) + 0x30000) == (char)uVar32))
        && (uVar30 <= uVar39)) && (uVar20 < uVar23)) {
      puVar21 = (ulong *)(ringbuffer + (uVar20 & ringbuffer_mask));
      lVar47 = 0;
      uVar20 = local_110;
      puVar33 = puVar2;
LAB_0035148e:
      if (uVar20 < 8) {
        for (uVar38 = 0;
            (uVar20 != uVar38 &&
            (*(char *)((long)puVar21 + uVar38) == *(char *)((long)puVar33 + uVar38)));
            uVar38 = uVar38 + 1) {
        }
      }
      else {
        if (*puVar33 == *puVar21) goto code_r0x003514a0;
        uVar38 = *puVar21 ^ *puVar33;
        uVar20 = 0;
        if (uVar38 != 0) {
          for (; (uVar38 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
          }
        }
        uVar38 = uVar20 >> 3 & 0x1fffffff;
      }
      uVar38 = uVar38 - lVar47;
      if ((1 < uVar38) && (uVar20 = uVar38 * 0x87 + 0x78f, uVar34 < uVar20)) {
        if (lVar43 != 0) {
          uVar20 = uVar20 - ((0x1ca10U >> ((byte)lVar43 & 0xe) & 0xe) + 0x27);
        }
        if (uVar34 < uVar20) {
          uVar34 = uVar20;
          uVar35 = uVar38;
          uVar50 = uVar30;
          local_168 = uVar38;
        }
      }
    }
    lVar43 = lVar43 + 1;
  } while( true );
LAB_00351799:
  if (lVar43 == 2) goto LAB_0035195f;
  uVar39 = uVar39 + 1;
  pHVar10->dict_num_lookups = uVar39;
  bVar19 = puVar11[uVar34];
  uVar35 = (ulong)bVar19;
  if ((uVar35 != 0) && (uVar35 <= local_110)) {
    pBVar12 = pBVar7->words;
    puVar21 = (ulong *)(pBVar12->data +
                       (ulong)pBVar12->offsets_by_length[uVar35] +
                       pBVar7->hash_table_words[uVar34] * uVar35);
    lVar47 = 0;
    puVar33 = puVar2;
    uVar50 = uVar35;
LAB_00351804:
    if (uVar50 < 8) {
      for (uVar50 = 0;
          ((bVar19 & 7) != uVar50 &&
          (*(char *)((long)puVar33 + uVar50) == *(char *)((long)puVar21 + uVar50)));
          uVar50 = uVar50 + 1) {
      }
    }
    else {
      if (*puVar21 == *puVar33) goto code_r0x00351816;
      uVar37 = *puVar33 ^ *puVar21;
      uVar50 = 0;
      if (uVar37 != 0) {
        for (; (uVar37 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
        }
      }
      uVar50 = uVar50 >> 3 & 0x1fffffff;
    }
    uVar50 = uVar50 - lVar47;
    if (((uVar50 != 0) && (uVar35 < pBVar7->cutoffTransformsCount + uVar50)) &&
       (uVar35 = (ulong)pBVar7->hash_table_words[uVar34] + uVar41 + lVar18 +
                 ((ulong)((uint)(pBVar7->cutoffTransforms >>
                                ((char)(uVar35 - uVar50) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar35 - uVar50) * 4 << (pBVar12->size_bits_by_length[uVar35] & 0x3f)),
       uVar35 <= uVar46)) {
      iVar49 = 0x1f;
      if ((uint)uVar35 != 0) {
        for (; (uint)uVar35 >> iVar49 == 0; iVar49 = iVar49 + -1) {
        }
      }
      uVar37 = (uVar50 * 0x87 - (ulong)(uint)(iVar49 * 0x1e)) + 0x780;
      if (uVar22 <= uVar37) {
        iVar42 = (uint)bVar19 - (int)uVar50;
        local_170 = local_170 + 1;
        pHVar10->dict_num_matches = local_170;
        uVar22 = uVar37;
        local_138 = uVar35;
        local_140 = uVar50;
      }
    }
  }
  lVar43 = lVar43 + 1;
  uVar34 = uVar34 + 1;
  goto LAB_00351799;
LAB_0035195f:
  local_170 = uVar22;
  if (local_170 < 0x7e5) {
LAB_0035196e:
    local_128 = local_128 + 1;
    position = uVar23 + 1;
    if (uVar40 < position) {
      if ((uint)((int)lVar29 * 4) + uVar40 < position) {
        uVar39 = uVar23 + 0x11;
        if (uVar4 <= uVar23 + 0x11) {
          uVar39 = uVar4;
        }
        for (; position < uVar39; position = position + 4) {
          pvVar8 = (hasher->privat)._H42.extra[0];
          uVar32 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar23 = (ulong)uVar32;
          uVar36 = uVar32 & 0x1ff;
          uVar25 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar36 * 2);
          pvVar9 = (hasher->privat)._H42.extra[1];
          *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar36 * 2) = uVar25 + 1;
          uVar16 = uVar25 & 0x1ff;
          uVar41 = position - *(uint *)((long)pvVar8 + uVar23 * 4);
          *(char *)((long)pvVar8 + (position & 0xffff) + 0x30000) = (char)uVar32;
          if (0xfffe < uVar41) {
            uVar41 = 0xffff;
          }
          *(short *)((long)pvVar9 + (ulong)uVar16 * 4 + (ulong)(uVar36 << 0xb)) = (short)uVar41;
          *(undefined2 *)((long)pvVar9 + (ulong)uVar16 * 4 + (ulong)(uVar36 << 0xb) + 2) =
               *(undefined2 *)((long)pvVar8 + uVar23 * 2 + 0x20000);
          *(int *)((long)pvVar8 + uVar23 * 4) = (int)position;
          *(short *)((long)pvVar8 + uVar23 * 2 + 0x20000) = (short)uVar16;
          local_128 = local_128 + 4;
        }
      }
      else {
        uVar39 = uVar23 + 9;
        if (uVar3 <= uVar23 + 9) {
          uVar39 = uVar3;
        }
        for (; position < uVar39; position = position + 2) {
          pvVar8 = (hasher->privat)._H42.extra[0];
          uVar32 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar23 = (ulong)uVar32;
          uVar36 = uVar32 & 0x1ff;
          uVar25 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar36 * 2);
          pvVar9 = (hasher->privat)._H42.extra[1];
          *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar36 * 2) = uVar25 + 1;
          uVar16 = uVar25 & 0x1ff;
          uVar41 = position - *(uint *)((long)pvVar8 + uVar23 * 4);
          *(char *)((long)pvVar8 + (position & 0xffff) + 0x30000) = (char)uVar32;
          if (0xfffe < uVar41) {
            uVar41 = 0xffff;
          }
          *(short *)((long)pvVar9 + (ulong)uVar16 * 4 + (ulong)(uVar36 << 0xb)) = (short)uVar41;
          *(undefined2 *)((long)pvVar9 + (ulong)uVar16 * 4 + (ulong)(uVar36 << 0xb) + 2) =
               *(undefined2 *)((long)pvVar8 + uVar23 * 2 + 0x20000);
          *(int *)((long)pvVar8 + uVar23 * 4) = (int)position;
          *(short *)((long)pvVar8 + uVar23 * 2 + 0x20000) = (short)uVar16;
          local_128 = local_128 + 2;
        }
      }
    }
    goto LAB_00351328;
  }
  uVar40 = local_128 + 4;
  local_d8 = 0;
LAB_00351b06:
  local_110 = local_110 - 1;
  local_100 = local_140 - 1;
  if (local_110 <= local_140 - 1) {
    local_100 = local_110;
  }
  if (4 < params->quality) {
    local_100 = 0;
  }
  uVar39 = uVar23 + 1;
  uVar41 = uVar17;
  if (uVar39 < uVar17) {
    uVar41 = uVar39;
  }
  local_c0 = sVar5 + uVar23 + 1;
  if (uVar17 <= local_c0) {
    local_c0 = uVar17;
  }
  if ((params->dictionary).contextual.context_based != 0) {
    local_d4 = (uint)(params->dictionary).contextual.context_map
                     [literal_context_lut[local_98 + 0x100] |
                      literal_context_lut[ringbuffer[uVar23 & ringbuffer_mask]]];
    local_98 = (ulong)ringbuffer[uVar23 & ringbuffer_mask];
  }
  pBVar7 = (params->dictionary).contextual.dict[local_d4];
  uVar46 = (params->dist).max_distance;
  pvVar8 = (hasher->privat)._H42.extra[0];
  pvVar9 = (hasher->privat)._H42.extra[1];
  uVar37 = uVar39 & ringbuffer_mask;
  puVar2 = (ulong *)(ringbuffer + uVar37);
  uVar32 = (uint)(*(int *)(ringbuffer + uVar37) * 0x1e35a7bd) >> 0x11;
  uVar34 = 0x7e4;
  uVar50 = 0;
  uVar35 = 0;
  lVar43 = 0;
  do {
    if (lVar43 == 0x10) {
      uVar24 = (ulong)uVar32;
      uVar36 = uVar32 & 0x1ff;
      sVar48 = (hasher->privat)._H42.max_hops;
      uVar44 = uVar39 - *(uint *)((long)pvVar8 + uVar24 * 4);
      uVar25 = *(ushort *)((long)pvVar8 + uVar24 * 2 + 0x20000);
      uVar16 = uVar36 << 0xb;
      uVar38 = 0;
      uVar20 = uVar44;
      uVar30 = local_100;
      do {
        local_100 = uVar30;
        uVar31 = uVar50;
        uVar45 = uVar35;
        uVar22 = uVar34;
        do {
          do {
            do {
              do {
                bVar51 = sVar48 == 0;
                sVar48 = sVar48 - 1;
                if ((bVar51) || (uVar38 = uVar38 + uVar20, uVar41 < uVar38)) {
                  uVar25 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar36 * 2);
                  *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar36 * 2) = uVar25 + 1;
                  uVar36 = uVar25 & 0x1ff;
                  *(char *)((long)pvVar8 + (uVar39 & 0xffff) + 0x30000) = (char)uVar32;
                  if (0xfffe < uVar44) {
                    uVar44 = 0xffff;
                  }
                  *(short *)((long)pvVar9 + (ulong)uVar36 * 4 + (ulong)uVar16) = (short)uVar44;
                  *(undefined2 *)((long)pvVar9 + (ulong)uVar36 * 4 + (ulong)uVar16 + 2) =
                       *(undefined2 *)((long)pvVar8 + uVar24 * 2 + 0x20000);
                  *(int *)((long)pvVar8 + uVar24 * 4) = (int)uVar39;
                  *(short *)((long)pvVar8 + uVar24 * 2 + 0x20000) = (short)uVar36;
                  iVar49 = 0;
                  if (uVar22 != 0x7e4) goto LAB_00352139;
                  pHVar10 = (hasher->privat)._H42.common;
                  uVar41 = pHVar10->dict_num_lookups;
                  local_e8 = pHVar10->dict_num_matches;
                  uVar22 = 0x7e4;
                  if (uVar41 >> 7 <= local_e8) {
                    uVar34 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                    puVar11 = pBVar7->hash_table_lengths;
                    iVar49 = 0;
                    lVar43 = 0;
                    goto LAB_00351f93;
                  }
                  iVar49 = 0;
                  goto LAB_00352139;
                }
                uVar34 = (ulong)uVar25;
                uVar25 = *(ushort *)((long)pvVar9 + uVar34 * 4 + (ulong)uVar16 + 2);
                uVar20 = (ulong)*(ushort *)((long)pvVar9 + uVar34 * 4 + (ulong)uVar16);
              } while (ringbuffer_mask < uVar37 + local_100);
              uVar35 = uVar39 - uVar38 & ringbuffer_mask;
              uVar34 = local_100 + uVar35;
            } while ((ringbuffer_mask < uVar34) ||
                    (ringbuffer[uVar37 + local_100] != ringbuffer[uVar34]));
            puVar21 = (ulong *)(ringbuffer + uVar35);
            lVar43 = 0;
            uVar34 = local_110;
            puVar33 = puVar2;
LAB_00351ddc:
            if (uVar34 < 8) {
              for (uVar35 = 0;
                  (uVar34 != uVar35 &&
                  (*(char *)((long)puVar21 + uVar35) == *(char *)((long)puVar33 + uVar35)));
                  uVar35 = uVar35 + 1) {
              }
            }
            else {
              if (*puVar33 == *puVar21) goto code_r0x00351dee;
              uVar35 = *puVar21 ^ *puVar33;
              uVar34 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                }
              }
              uVar35 = uVar34 >> 3 & 0x1fffffff;
            }
            uVar35 = uVar35 - lVar43;
          } while (uVar35 < 4);
          iVar49 = 0x1f;
          if ((uint)uVar38 != 0) {
            for (; (uint)uVar38 >> iVar49 == 0; iVar49 = iVar49 + -1) {
            }
          }
          uVar34 = (ulong)(iVar49 * -0x1e + 0x780) + uVar35 * 0x87;
          uVar50 = uVar38;
          uVar30 = uVar35;
        } while (uVar34 <= uVar22);
      } while( true );
    }
    uVar30 = (ulong)dist_cache[lVar43];
    uVar20 = uVar39 - uVar30;
    if ((((lVar43 == 0) || (*(char *)((long)pvVar8 + (uVar20 & 0xffff) + 0x30000) == (char)uVar32))
        && (uVar30 <= uVar41)) && (uVar20 < uVar39)) {
      puVar21 = (ulong *)(ringbuffer + (uVar20 & ringbuffer_mask));
      lVar47 = 0;
      uVar20 = local_110;
      puVar33 = puVar2;
LAB_00351c58:
      if (uVar20 < 8) {
        for (uVar38 = 0;
            (uVar20 != uVar38 &&
            (*(char *)((long)puVar21 + uVar38) == *(char *)((long)puVar33 + uVar38)));
            uVar38 = uVar38 + 1) {
        }
      }
      else {
        if (*puVar33 == *puVar21) goto code_r0x00351c6a;
        uVar38 = *puVar21 ^ *puVar33;
        uVar20 = 0;
        if (uVar38 != 0) {
          for (; (uVar38 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
          }
        }
        uVar38 = uVar20 >> 3 & 0x1fffffff;
      }
      uVar38 = uVar38 - lVar47;
      if ((1 < uVar38) && (uVar20 = uVar38 * 0x87 + 0x78f, uVar34 < uVar20)) {
        if (lVar43 != 0) {
          uVar20 = uVar20 - ((0x1ca10U >> ((byte)lVar43 & 0xe) & 0xe) + 0x27);
        }
        if (uVar34 < uVar20) {
          uVar34 = uVar20;
          uVar35 = uVar38;
          uVar50 = uVar30;
          local_100 = uVar38;
        }
      }
    }
    lVar43 = lVar43 + 1;
  } while( true );
LAB_00351f93:
  if (lVar43 == 2) goto LAB_00352139;
  uVar41 = uVar41 + 1;
  pHVar10->dict_num_lookups = uVar41;
  bVar19 = puVar11[uVar34];
  uVar35 = (ulong)bVar19;
  if ((uVar35 != 0) && (uVar35 <= local_110)) {
    pBVar12 = pBVar7->words;
    puVar21 = (ulong *)(pBVar12->data +
                       (ulong)pBVar12->offsets_by_length[uVar35] +
                       pBVar7->hash_table_words[uVar34] * uVar35);
    lVar47 = 0;
    uVar50 = uVar35;
    puVar33 = puVar2;
LAB_00352007:
    if (uVar50 < 8) {
      for (uVar50 = 0;
          ((bVar19 & 7) != uVar50 &&
          (*(char *)((long)puVar33 + uVar50) == *(char *)((long)puVar21 + uVar50)));
          uVar50 = uVar50 + 1) {
      }
    }
    else {
      if (*puVar21 == *puVar33) goto code_r0x00352019;
      uVar37 = *puVar33 ^ *puVar21;
      uVar50 = 0;
      if (uVar37 != 0) {
        for (; (uVar37 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
        }
      }
      uVar50 = uVar50 >> 3 & 0x1fffffff;
    }
    uVar50 = uVar50 - lVar47;
    if (((uVar50 != 0) && (uVar35 < pBVar7->cutoffTransformsCount + uVar50)) &&
       (uVar35 = (ulong)pBVar7->hash_table_words[uVar34] + lVar18 + local_c0 +
                 ((ulong)((uint)(pBVar7->cutoffTransforms >>
                                ((char)(uVar35 - uVar50) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar35 - uVar50) * 4 << (pBVar12->size_bits_by_length[uVar35] & 0x3f)),
       uVar35 <= uVar46)) {
      iVar14 = 0x1f;
      if ((uint)uVar35 != 0) {
        for (; (uint)uVar35 >> iVar14 == 0; iVar14 = iVar14 + -1) {
        }
      }
      uVar37 = (uVar50 * 0x87 - (ulong)(uint)(iVar14 * 0x1e)) + 0x780;
      if (uVar22 <= uVar37) {
        iVar49 = (uint)bVar19 - (int)uVar50;
        local_e8 = local_e8 + 1;
        pHVar10->dict_num_matches = local_e8;
        uVar22 = uVar37;
        uVar31 = uVar35;
        uVar45 = uVar50;
      }
    }
  }
  lVar43 = lVar43 + 1;
  uVar34 = uVar34 + 1;
  goto LAB_00351f93;
LAB_00352139:
  if (uVar22 < local_170 + 0xaf) {
    uVar31 = local_138;
    uVar45 = local_140;
    uVar39 = uVar23;
    sVar48 = local_128;
    local_c0 = uVar23 + sVar5;
    iVar49 = iVar42;
    if (uVar17 <= uVar23 + sVar5) {
      local_c0 = uVar17;
    }
    goto LAB_003521d4;
  }
  sVar48 = uVar40;
  if (local_d8 == 3) goto LAB_003521d4;
  local_128 = local_128 + 1;
  local_d8 = local_d8 + 1;
  uVar41 = uVar23 + 5;
  local_140 = uVar45;
  uVar23 = uVar39;
  local_170 = uVar22;
  local_138 = uVar31;
  sVar48 = local_128;
  iVar42 = iVar49;
  if (uVar1 <= uVar41) goto LAB_003521d4;
  goto LAB_00351b06;
LAB_003521d4:
  local_128 = sVar48;
  local_c0 = local_c0 + sVar6;
  if (local_c0 < uVar31) {
LAB_003521f1:
    uVar40 = uVar31 + 0xf;
  }
  else {
    if (uVar31 == (long)*dist_cache) {
      uVar40 = 0;
      goto LAB_00352269;
    }
    uVar40 = 1;
    if (uVar31 != (long)dist_cache[1]) {
      uVar40 = (uVar31 + 3) - (long)*dist_cache;
      if (uVar40 < 7) {
        bVar19 = (byte)((int)uVar40 << 2);
        uVar32 = 0x9750468;
      }
      else {
        uVar40 = (uVar31 + 3) - (long)dist_cache[1];
        if (6 < uVar40) {
          uVar40 = 2;
          if ((uVar31 != (long)dist_cache[2]) && (uVar40 = 3, uVar31 != (long)dist_cache[3]))
          goto LAB_003521f1;
          goto LAB_003521f5;
        }
        bVar19 = (byte)((int)uVar40 << 2);
        uVar32 = 0xfdb1ace;
      }
      uVar40 = (ulong)(uVar32 >> (bVar19 & 0x1f) & 0xf);
    }
  }
LAB_003521f5:
  if ((uVar31 <= local_c0) && (uVar40 != 0)) {
    dist_cache[3] = dist_cache[2];
    uVar13 = *(undefined8 *)dist_cache;
    *(undefined8 *)(dist_cache + 1) = uVar13;
    iVar42 = (int)uVar31;
    *dist_cache = iVar42;
    dist_cache[4] = iVar42 + -1;
    dist_cache[5] = iVar42 + 1;
    dist_cache[6] = iVar42 + -2;
    dist_cache[7] = iVar42 + 2;
    dist_cache[8] = iVar42 + -3;
    dist_cache[9] = iVar42 + 3;
    iVar42 = (int)uVar13;
    dist_cache[10] = iVar42 + -1;
    dist_cache[0xb] = iVar42 + 1;
    dist_cache[0xc] = iVar42 + -2;
    dist_cache[0xd] = iVar42 + 2;
    *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar42 + 3,iVar42 + -3);
  }
LAB_00352269:
  uVar32 = (uint)local_128;
  local_e0->insert_len_ = uVar32;
  local_e0->copy_len_ = iVar49 << 0x19 | (uint)uVar45;
  uVar41 = (ulong)(params->dist).num_direct_distance_codes;
  uVar23 = uVar41 + 0x10;
  uVar26 = 0;
  if (uVar23 <= uVar40) {
    uVar16 = (params->dist).distance_postfix_bits;
    bVar19 = (byte)uVar16;
    uVar41 = ((4L << (bVar19 & 0x3f)) + (uVar40 - uVar41)) - 0x10;
    uVar36 = 0x1f;
    uVar27 = (uint)uVar41;
    if (uVar27 != 0) {
      for (; uVar27 >> uVar36 == 0; uVar36 = uVar36 - 1) {
      }
    }
    uVar36 = (uVar36 ^ 0xffffffe0) + 0x1f;
    uVar46 = (ulong)((uVar41 >> ((ulong)uVar36 & 0x3f) & 1) != 0);
    lVar43 = (ulong)uVar36 - (ulong)uVar16;
    uVar40 = (~(-1 << (bVar19 & 0x1f)) & uVar27) + uVar23 +
             (uVar46 + lVar43 * 2 + 0xfffe << (bVar19 & 0x3f)) | lVar43 * 0x400;
    uVar26 = (uint32_t)(uVar41 - (uVar46 + 2 << ((byte)uVar36 & 0x3f)) >> (bVar19 & 0x3f));
  }
  local_e0->dist_prefix_ = (uint16_t)uVar40;
  local_e0->dist_extra_ = uVar26;
  if (5 < local_128) {
    if (local_128 < 0x82) {
      uVar32 = 0x1f;
      uVar16 = (uint)(local_128 - 2);
      if (uVar16 != 0) {
        for (; uVar16 >> uVar32 == 0; uVar32 = uVar32 - 1) {
        }
      }
      uVar32 = (int)(local_128 - 2 >> ((char)(uVar32 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar32 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_128 < 0x842) {
      uVar16 = 0x1f;
      if (uVar32 - 0x42 != 0) {
        for (; uVar32 - 0x42 >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      uVar32 = (uVar16 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar32 = 0x15;
      if (0x1841 < local_128) {
        uVar32 = (uint)(ushort)(0x17 - (local_128 < 0x5842));
      }
    }
  }
  uVar16 = iVar49 + (uint)uVar45;
  if (uVar16 < 10) {
    uVar36 = uVar16 - 2;
  }
  else if (uVar16 < 0x86) {
    uVar16 = uVar16 - 6;
    uVar36 = 0x1f;
    if (uVar16 != 0) {
      for (; uVar16 >> uVar36 == 0; uVar36 = uVar36 - 1) {
      }
    }
    uVar36 = (uVar16 >> ((char)(uVar36 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar36 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar36 = 0x17;
    if (uVar16 < 0x846) {
      uVar36 = 0x1f;
      if (uVar16 - 0x46 != 0) {
        for (; uVar16 - 0x46 >> uVar36 == 0; uVar36 = uVar36 - 1) {
        }
      }
      uVar36 = (uVar36 ^ 0xffe0) + 0x2c;
    }
  }
  uVar25 = (ushort)uVar36;
  uVar15 = (uVar25 & 7) + ((ushort)uVar32 & 7) * 8;
  if ((((uVar40 & 0x3ff) == 0) && ((ushort)uVar32 < 8)) && (uVar25 < 0x10)) {
    if (7 < uVar25) {
      uVar15 = uVar15 + 0x40;
    }
  }
  else {
    iVar42 = ((uVar32 & 0xffff) >> 3) * 3 + ((uVar36 & 0xffff) >> 3);
    uVar15 = uVar15 + ((ushort)(0x520d40 >> ((char)iVar42 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar42 * 0x40 + 0x40;
  }
  local_e0->cmd_prefix_ = uVar15;
  *num_literals = *num_literals + local_128;
  position = uVar45 + uVar39;
  uVar23 = sVar28;
  if (position < sVar28) {
    uVar23 = position;
  }
  uVar41 = uVar39 + 2;
  if (uVar31 < uVar45 >> 2) {
    uVar40 = position + uVar31 * -4;
    if (uVar40 < uVar41) {
      uVar40 = uVar41;
    }
    uVar41 = uVar40;
    if (uVar23 < uVar40) {
      uVar41 = uVar23;
    }
  }
  uVar40 = uVar39 + lVar29 + uVar45 * 2;
  local_e0 = local_e0 + 1;
  for (; uVar41 < uVar23; uVar41 = uVar41 + 1) {
    pvVar8 = (hasher->privat)._H42.extra[0];
    uVar32 = (uint)(*(int *)(ringbuffer + (uVar41 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
    uVar39 = (ulong)uVar32;
    uVar36 = uVar32 & 0x1ff;
    uVar25 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar36 * 2);
    pvVar9 = (hasher->privat)._H42.extra[1];
    *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar36 * 2) = uVar25 + 1;
    uVar16 = uVar25 & 0x1ff;
    uVar46 = uVar41 - *(uint *)((long)pvVar8 + uVar39 * 4);
    if (0xfffe < uVar46) {
      uVar46 = 0xffff;
    }
    *(char *)((long)pvVar8 + (uVar41 & 0xffff) + 0x30000) = (char)uVar32;
    *(short *)((long)pvVar9 + (ulong)uVar16 * 4 + (ulong)(uVar36 << 0xb)) = (short)uVar46;
    *(undefined2 *)((long)pvVar9 + (ulong)uVar16 * 4 + (ulong)(uVar36 << 0xb) + 2) =
         *(undefined2 *)((long)pvVar8 + uVar39 * 2 + 0x20000);
    *(int *)((long)pvVar8 + uVar39 * 4) = (int)uVar41;
    *(short *)((long)pvVar8 + uVar39 * 2 + 0x20000) = (short)uVar16;
  }
  local_128 = 0;
  goto LAB_0035131b;
code_r0x00352019:
  puVar21 = puVar21 + 1;
  puVar33 = puVar33 + 1;
  uVar50 = uVar50 - 8;
  lVar47 = lVar47 + -8;
  goto LAB_00352007;
code_r0x00351dee:
  puVar33 = puVar33 + 1;
  puVar21 = puVar21 + 1;
  uVar34 = uVar34 - 8;
  lVar43 = lVar43 + -8;
  goto LAB_00351ddc;
code_r0x00351c6a:
  puVar33 = puVar33 + 1;
  puVar21 = puVar21 + 1;
  uVar20 = uVar20 - 8;
  lVar47 = lVar47 + -8;
  goto LAB_00351c58;
code_r0x00351816:
  puVar21 = puVar21 + 1;
  puVar33 = puVar33 + 1;
  uVar50 = uVar50 - 8;
  lVar47 = lVar47 + -8;
  goto LAB_00351804;
code_r0x00351610:
  puVar33 = puVar33 + 1;
  puVar21 = puVar21 + 1;
  uVar34 = uVar34 - 8;
  lVar43 = lVar43 + -8;
  goto LAB_003515ff;
code_r0x003514a0:
  puVar33 = puVar33 + 1;
  puVar21 = puVar21 + 1;
  uVar20 = uVar20 - 8;
  lVar47 = lVar47 + -8;
  goto LAB_0035148e;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}